

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O1

idx_t duckdb::TernaryExecutor::
      SelectLoopSelSwitch<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::UpperInclusiveBetweenOperator,true>
                (UnifiedVectorFormat *adata,UnifiedVectorFormat *bdata,UnifiedVectorFormat *cdata,
                SelectionVector *sel,idx_t count,SelectionVector *true_sel,
                SelectionVector *false_sel)

{
  SelectionVector *pSVar1;
  data_ptr_t pdVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  SelectionVector *pSVar5;
  data_ptr_t pdVar6;
  sel_t *psVar7;
  sel_t *psVar8;
  sel_t *psVar9;
  sel_t *psVar10;
  sel_t *psVar11;
  sel_t *psVar12;
  long lVar13;
  long lVar14;
  idx_t iVar15;
  bool bVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  
  pSVar1 = adata->sel;
  pdVar2 = adata->data;
  pSVar3 = bdata->sel;
  pdVar4 = bdata->data;
  pSVar5 = cdata->sel;
  pdVar6 = cdata->data;
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      if (count == 0) {
        lVar23 = 0;
      }
      else {
        psVar7 = sel->sel_vector;
        psVar8 = pSVar1->sel_vector;
        psVar9 = pSVar3->sel_vector;
        psVar10 = pSVar5->sel_vector;
        psVar11 = false_sel->sel_vector;
        lVar23 = 0;
        uVar22 = 0;
        do {
          uVar21 = uVar22;
          if (psVar7 != (sel_t *)0x0) {
            uVar21 = (ulong)psVar7[uVar22];
          }
          uVar18 = uVar22;
          if (psVar8 != (sel_t *)0x0) {
            uVar18 = (ulong)psVar8[uVar22];
          }
          uVar19 = uVar22;
          if (psVar9 != (sel_t *)0x0) {
            uVar19 = (ulong)psVar9[uVar22];
          }
          uVar17 = uVar22;
          if (psVar10 != (sel_t *)0x0) {
            uVar17 = (ulong)psVar10[uVar22];
          }
          lVar13 = *(long *)(pdVar2 + uVar18 * 0x10 + 8);
          if ((*(long *)(pdVar4 + uVar19 * 0x10 + 8) < lVar13) ||
             (uVar20 = 1,
             *(ulong *)(pdVar4 + uVar19 * 0x10) < *(ulong *)(pdVar2 + uVar18 * 0x10) &&
             lVar13 == *(long *)(pdVar4 + uVar19 * 0x10 + 8))) {
            lVar14 = *(long *)(pdVar6 + uVar17 * 0x10 + 8);
            uVar20 = (ulong)(*(ulong *)(pdVar6 + uVar17 * 0x10) < *(ulong *)(pdVar2 + uVar18 * 0x10)
                             && lVar13 == lVar14 || lVar13 != lVar14 && lVar14 <= lVar13);
          }
          psVar11[lVar23] = (sel_t)uVar21;
          lVar23 = lVar23 + uVar20;
          uVar22 = uVar22 + 1;
        } while (count != uVar22);
      }
      return count - lVar23;
    }
    if (count != 0) {
      psVar7 = sel->sel_vector;
      psVar8 = pSVar1->sel_vector;
      psVar9 = pSVar3->sel_vector;
      psVar10 = pSVar5->sel_vector;
      psVar11 = true_sel->sel_vector;
      iVar15 = 0;
      uVar22 = 0;
      do {
        uVar21 = uVar22;
        if (psVar7 != (sel_t *)0x0) {
          uVar21 = (ulong)psVar7[uVar22];
        }
        uVar18 = uVar22;
        if (psVar8 != (sel_t *)0x0) {
          uVar18 = (ulong)psVar8[uVar22];
        }
        uVar19 = uVar22;
        if (psVar9 != (sel_t *)0x0) {
          uVar19 = (ulong)psVar9[uVar22];
        }
        uVar17 = uVar22;
        if (psVar10 != (sel_t *)0x0) {
          uVar17 = (ulong)psVar10[uVar22];
        }
        lVar23 = *(long *)(pdVar2 + uVar18 * 0x10 + 8);
        if ((*(long *)(pdVar4 + uVar19 * 0x10 + 8) < lVar23) ||
           (*(ulong *)(pdVar4 + uVar19 * 0x10) < *(ulong *)(pdVar2 + uVar18 * 0x10) &&
            lVar23 == *(long *)(pdVar4 + uVar19 * 0x10 + 8))) {
          uVar18 = (ulong)((*(ulong *)(pdVar2 + uVar18 * 0x10) <= *(ulong *)(pdVar6 + uVar17 * 0x10)
                           || lVar23 != *(long *)(pdVar6 + uVar17 * 0x10 + 8)) &&
                          lVar23 <= *(long *)(pdVar6 + uVar17 * 0x10 + 8));
        }
        else {
          uVar18 = 0;
        }
        psVar11[iVar15] = (sel_t)uVar21;
        iVar15 = iVar15 + uVar18;
        uVar22 = uVar22 + 1;
      } while (count != uVar22);
      return iVar15;
    }
  }
  else if (count != 0) {
    psVar7 = sel->sel_vector;
    psVar8 = pSVar1->sel_vector;
    psVar9 = pSVar3->sel_vector;
    psVar10 = pSVar5->sel_vector;
    psVar11 = true_sel->sel_vector;
    psVar12 = false_sel->sel_vector;
    iVar15 = 0;
    lVar23 = 0;
    uVar22 = 0;
    do {
      uVar21 = uVar22;
      if (psVar7 != (sel_t *)0x0) {
        uVar21 = (ulong)psVar7[uVar22];
      }
      uVar18 = uVar22;
      if (psVar8 != (sel_t *)0x0) {
        uVar18 = (ulong)psVar8[uVar22];
      }
      uVar19 = uVar22;
      if (psVar9 != (sel_t *)0x0) {
        uVar19 = (ulong)psVar9[uVar22];
      }
      uVar17 = uVar22;
      if (psVar10 != (sel_t *)0x0) {
        uVar17 = (ulong)psVar10[uVar22];
      }
      lVar13 = *(long *)(pdVar2 + uVar18 * 0x10 + 8);
      if ((*(long *)(pdVar4 + uVar19 * 0x10 + 8) < lVar13) ||
         (*(ulong *)(pdVar4 + uVar19 * 0x10) < *(ulong *)(pdVar2 + uVar18 * 0x10) &&
          lVar13 == *(long *)(pdVar4 + uVar19 * 0x10 + 8))) {
        bVar16 = (*(ulong *)(pdVar2 + uVar18 * 0x10) <= *(ulong *)(pdVar6 + uVar17 * 0x10) ||
                 lVar13 != *(long *)(pdVar6 + uVar17 * 0x10 + 8)) &&
                 lVar13 <= *(long *)(pdVar6 + uVar17 * 0x10 + 8);
      }
      else {
        bVar16 = false;
      }
      psVar11[iVar15] = (sel_t)uVar21;
      iVar15 = iVar15 + bVar16;
      psVar12[lVar23] = (sel_t)uVar21;
      lVar23 = lVar23 + (ulong)(bVar16 ^ 1);
      uVar22 = uVar22 + 1;
    } while (count != uVar22);
    return iVar15;
  }
  return 0;
}

Assistant:

static inline idx_t SelectLoopSelSwitch(UnifiedVectorFormat &adata, UnifiedVectorFormat &bdata,
	                                        UnifiedVectorFormat &cdata, const SelectionVector *sel, idx_t count,
	                                        SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, false>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, false, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		}
	}